

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorShowLabel::dropEvent(QColorShowLabel *this,QDropEvent *e)

{
  bool bVar1;
  int __fd;
  socklen_t *in_RCX;
  sockaddr *__addr;
  QDropEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QColor QVar2;
  QColor color;
  QRgb _t1;
  QWidget *v;
  QColor local_48;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  v = in_RDI;
  QDropEvent::mimeData(in_RSI);
  QMimeData::colorData();
  QVar2 = qvariant_cast<QColor>((QVariant *)v);
  local_48._0_8_ = QVar2._0_8_;
  local_38 = (undefined1 *)local_48._0_8_;
  puStack_30._0_6_ = QVar2.ct._4_6_;
  ::QVariant::~QVariant(&local_28);
  bVar1 = QColor::isValid((QColor *)&local_38);
  if (bVar1) {
    *(undefined1 **)(in_RDI + 1) = local_38;
    *(undefined4 *)&in_RDI[1].field_0x8 = puStack_30._0_4_;
    *(undefined2 *)&in_RDI[1].field_0xc = puStack_30._4_2_;
    QWidget::repaint(in_RDI);
    _t1 = (QRgb)((ulong)in_RDI >> 0x20);
    __fd = QColor::rgb();
    colorDropped((QColorShowLabel *)0x7342e5,_t1);
    QEvent::accept((QEvent *)in_RSI,__fd,__addr,in_RCX);
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShowLabel::dropEvent(QDropEvent *e)
{
    QColor color = qvariant_cast<QColor>(e->mimeData()->colorData());
    if (color.isValid()) {
        col = color;
        repaint();
        emit colorDropped(col.rgb());
        e->accept();
    } else {
        e->ignore();
    }
}